

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeRegistry.h
# Opt level: O2

bool __thiscall
anurbs::TypeEntry<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_anurbs::Model>::
save(TypeEntry<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_anurbs::Model>
     *this,Model *model,size_t index,Json *target)

{
  element_type *peVar1;
  Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_> *data;
  bool bVar2;
  Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_> entry;
  __shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2> local_38;
  element_type *local_28;
  
  Model::get<anurbs::Curve<3l,anurbs::Ref<anurbs::NurbsCurveGeometry<3l>>>>
            ((Model *)&stack0xffffffffffffffd8,(size_t)model);
  if (local_28 != (element_type *)0x0) {
    std::
    __shared_ptr<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)&local_38,
                   &(local_28->m_data).
                    super___shared_ptr<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    peVar1 = local_38._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    if (peVar1 != (Attributes *)0x0) {
      data = Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_>::operator*
                       ((Ref<anurbs::Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>_> *)
                        &stack0xffffffffffffffd8);
      Curve<3L,_anurbs::Ref<anurbs::NurbsCurveGeometry<3L>_>_>::save(model,data,target);
      std::__shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_38,
                 &(local_28->m_attributes).
                  super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>);
      Attributes::
      save<anurbs::Model,nlohmann::basic_json<anurbs::FiFoMap,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (local_38._M_ptr,model,target);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
      bVar2 = true;
      goto LAB_002112b9;
    }
  }
  bVar2 = false;
LAB_002112b9:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return bVar2;
}

Assistant:

bool save(const TModel& model, const size_t index, Json& target) override
    {
        const auto entry = model.template get<TData>(index);

        if (entry.is_empty() || entry.data() == nullptr) {
            return false;
        }

        TData::save(model, *entry, target);
        entry.attributes()->save(model, target);

        return true;
    }